

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::OrientedDiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  undefined4 uVar16;
  RayHit *pRVar17;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  Scene *scene;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_15c [20];
  undefined1 local_148 [16];
  float local_138;
  int local_134;
  int local_130;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_12c;
  float local_120;
  float local_11c;
  uint local_118;
  RTCFilterFunctionNArguments local_108;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar18;
  undefined1 auVar34 [64];
  
  pSVar8 = context->scene;
  uVar18 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  lVar19 = *(long *)&pGVar9->field_0x58;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24 = *(undefined1 (*) [16])(lVar19 + _Var10 * uVar18);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar25 = *(undefined1 (*) [16])(lVar19 + _Var10 * uVar20);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar27 = *(undefined1 (*) [16])(lVar19 + _Var10 * uVar21);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar35 = *(undefined1 (*) [16])(lVar19 + _Var10 * uVar22);
  auVar36 = vunpcklps_avx(auVar24,auVar27);
  auVar28 = vunpckhps_avx(auVar24,auVar27);
  auVar24 = vunpcklps_avx(auVar25,auVar35);
  auVar29 = vunpckhps_avx(auVar25,auVar35);
  auVar33 = vunpcklps_avx(auVar36,auVar24);
  local_148 = vunpckhps_avx(auVar36,auVar24);
  lVar19 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  auVar24 = *(undefined1 (*) [16])(lVar19 + uVar18 * (long)p_Var11);
  auVar25 = *(undefined1 (*) [16])(lVar19 + uVar20 * (long)p_Var11);
  auVar27 = *(undefined1 (*) [16])(lVar19 + uVar21 * (long)p_Var11);
  auVar35 = *(undefined1 (*) [16])(lVar19 + (long)p_Var11 * uVar22);
  auVar36 = vunpcklps_avx(auVar24,auVar27);
  auVar24 = vunpckhps_avx(auVar24,auVar27);
  auVar27 = vunpcklps_avx(auVar25,auVar35);
  auVar25 = vunpckhps_avx(auVar25,auVar35);
  local_58 = vunpcklps_avx(auVar24,auVar25);
  local_98 = vunpcklps_avx(auVar36,auVar27);
  local_68 = vunpckhps_avx(auVar36,auVar27);
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar35._0_4_ = local_98._0_4_ * fVar1 + fVar2 * local_68._0_4_ + fVar3 * local_58._0_4_;
  auVar35._4_4_ = local_98._4_4_ * fVar1 + fVar2 * local_68._4_4_ + fVar3 * local_58._4_4_;
  auVar35._8_4_ = local_98._8_4_ * fVar1 + fVar2 * local_68._8_4_ + fVar3 * local_58._8_4_;
  auVar35._12_4_ = local_98._12_4_ * fVar1 + fVar2 * local_68._12_4_ + fVar3 * local_58._12_4_;
  auVar25 = vcmpps_avx(auVar35,ZEXT416(0) << 0x20,4);
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = &DAT_3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  auVar24 = vblendvps_avx(auVar36,auVar35,auVar25);
  auVar26 = vunpcklps_avx(auVar28,auVar29);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar37._4_4_ = fVar4;
  auVar37._0_4_ = fVar4;
  auVar37._8_4_ = fVar4;
  auVar37._12_4_ = fVar4;
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar38._4_4_ = fVar5;
  auVar38._0_4_ = fVar5;
  auVar38._8_4_ = fVar5;
  auVar38._12_4_ = fVar5;
  auVar27 = vsubps_avx(auVar26,auVar38);
  auVar38 = local_58;
  auVar35 = vsubps_avx(local_148,auVar37);
  auVar37 = local_68;
  fVar6 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar39._4_4_ = fVar6;
  auVar39._0_4_ = fVar6;
  auVar39._8_4_ = fVar6;
  auVar39._12_4_ = fVar6;
  auVar36 = vsubps_avx(auVar33,auVar39);
  auVar23._0_4_ =
       local_98._0_4_ * auVar36._0_4_ +
       auVar27._0_4_ * local_58._0_4_ + local_68._0_4_ * auVar35._0_4_;
  auVar23._4_4_ =
       local_98._4_4_ * auVar36._4_4_ +
       auVar27._4_4_ * local_58._4_4_ + local_68._4_4_ * auVar35._4_4_;
  auVar23._8_4_ =
       local_98._8_4_ * auVar36._8_4_ +
       auVar27._8_4_ * local_58._8_4_ + local_68._8_4_ * auVar35._8_4_;
  auVar23._12_4_ =
       local_98._12_4_ * auVar36._12_4_ +
       auVar27._12_4_ * local_58._12_4_ + local_68._12_4_ * auVar35._12_4_;
  local_a8 = vdivps_avx(auVar23,auVar24);
  auVar31 = ZEXT1664(local_a8);
  uVar16 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar24._4_4_ = uVar16;
  auVar24._0_4_ = uVar16;
  auVar24._8_4_ = uVar16;
  auVar24._12_4_ = uVar16;
  auVar24 = vcmpps_avx(auVar24,local_a8,2);
  fVar7 = (ray->super_RayK<1>).tfar;
  auVar27._4_4_ = fVar7;
  auVar27._0_4_ = fVar7;
  auVar27._8_4_ = fVar7;
  auVar27._12_4_ = fVar7;
  auVar27 = vcmpps_avx(local_a8,auVar27,2);
  auVar24 = vandps_avx(auVar27,auVar24);
  auVar27 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar27 = vpcmpgtd_avx(auVar27,_DAT_01ff0cf0);
  auVar24 = vandps_avx(auVar24,auVar27);
  auVar27 = auVar25 & auVar24;
  if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0') {
    auVar24 = vandps_avx(auVar24,auVar25);
    auVar36 = vunpckhps_avx(auVar28,auVar29);
    fVar7 = local_a8._0_4_;
    fVar12 = local_a8._4_4_;
    fVar13 = local_a8._8_4_;
    fVar14 = local_a8._12_4_;
    auVar28._0_4_ = fVar6 + fVar1 * fVar7;
    auVar28._4_4_ = fVar6 + fVar1 * fVar12;
    auVar28._8_4_ = fVar6 + fVar1 * fVar13;
    auVar28._12_4_ = fVar6 + fVar1 * fVar14;
    auVar30._0_4_ = fVar4 + fVar2 * fVar7;
    auVar30._4_4_ = fVar4 + fVar2 * fVar12;
    auVar30._8_4_ = fVar4 + fVar2 * fVar13;
    auVar30._12_4_ = fVar4 + fVar2 * fVar14;
    auVar32._0_4_ = fVar5 + fVar3 * fVar7;
    auVar32._4_4_ = fVar5 + fVar3 * fVar12;
    auVar32._8_4_ = fVar5 + fVar3 * fVar13;
    auVar32._12_4_ = fVar5 + fVar3 * fVar14;
    auVar25 = vsubps_avx(auVar28,auVar33);
    auVar27 = vsubps_avx(auVar30,local_148);
    auVar35 = vsubps_avx(auVar32,auVar26);
    auVar29._0_4_ =
         auVar25._0_4_ * auVar25._0_4_ +
         auVar27._0_4_ * auVar27._0_4_ + auVar35._0_4_ * auVar35._0_4_;
    auVar29._4_4_ =
         auVar25._4_4_ * auVar25._4_4_ +
         auVar27._4_4_ * auVar27._4_4_ + auVar35._4_4_ * auVar35._4_4_;
    auVar29._8_4_ =
         auVar25._8_4_ * auVar25._8_4_ +
         auVar27._8_4_ * auVar27._8_4_ + auVar35._8_4_ * auVar35._8_4_;
    auVar29._12_4_ =
         auVar25._12_4_ * auVar25._12_4_ +
         auVar27._12_4_ * auVar27._12_4_ + auVar35._12_4_ * auVar35._12_4_;
    auVar25._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar25._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar25._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar25._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar25 = vcmpps_avx(auVar29,auVar25,1);
    auVar27 = auVar24 & auVar25;
    if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0')
    {
      auVar24 = vandps_avx(auVar24,auVar25);
      local_c8 = ZEXT432(0) << 0x20;
      local_88 = local_68._0_8_;
      uStack_80 = local_68._8_8_;
      local_78 = local_58._0_8_;
      uStack_70 = local_58._8_8_;
      local_15c._4_16_ = auVar24;
      auVar33._8_4_ = 0x7f800000;
      auVar33._0_8_ = 0x7f8000007f800000;
      auVar33._12_4_ = 0x7f800000;
      auVar34 = ZEXT1664(auVar33);
      auVar25 = vblendvps_avx(auVar33,local_a8,auVar24);
      auVar27 = vshufps_avx(auVar25,auVar25,0xb1);
      auVar27 = vminps_avx(auVar27,auVar25);
      auVar35 = vshufpd_avx(auVar27,auVar27,1);
      auVar27 = vminps_avx(auVar35,auVar27);
      auVar25 = vcmpps_avx(auVar25,auVar27,0);
      auVar27 = auVar24 & auVar25;
      if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0'
         ) {
        auVar24 = vandps_avx(auVar25,auVar24);
      }
      uVar15 = vmovmskps_avx(auVar24);
      lVar19 = 0;
      local_68 = auVar37;
      local_58 = auVar38;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      do {
        local_120 = *(float *)(local_48 + lVar19 * 4);
        pRVar17 = (RayHit *)(ulong)(uint)local_120;
        pGVar9 = (pSVar8->geometries).items[(long)pRVar17].ptr;
        if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
          *(undefined4 *)(local_15c + lVar19 * 4 + 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar1 = *(float *)(local_c8 + lVar19 * 4);
            fVar2 = *(float *)(local_c8 + lVar19 * 4 + 0x10);
            (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar19 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_98 + lVar19 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)((long)&local_88 + lVar19 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)((long)&local_78 + lVar19 * 4);
            ray->u = fVar1;
            ray->v = fVar2;
            ray->primID = (Disc->primIDs).field_0.i[lVar19];
            ray->geomID = (uint)local_120;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_138 = *(float *)(local_98 + lVar19 * 4);
          local_134 = *(int *)((long)&local_88 + lVar19 * 4);
          local_130 = *(int *)((long)&local_78 + lVar19 * 4);
          local_12c.field_0.x = *(float *)(local_c8 + lVar19 * 4);
          local_12c.field_0.y = *(float *)(local_c8 + lVar19 * 4 + 0x10);
          local_12c.field_0.z = (float)(Disc->primIDs).field_0.i[lVar19];
          local_11c = (float)context->user->instID[0];
          local_118 = context->user->instPrimID[0];
          local_148._0_4_ = (ray->super_RayK<1>).tfar;
          (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar19 * 4);
          local_15c._0_4_ = -NAN;
          local_108.valid = (int *)local_15c;
          local_108.geometryUserPtr = pGVar9->userPtr;
          local_108.context = context->user;
          local_108.ray = (RTCRayN *)ray;
          local_108.hit = (RTCHitN *)&local_138;
          local_108.N = 1;
          local_d8 = auVar31._0_16_;
          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ea536c:
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_108);
                auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar31 = ZEXT1664(local_d8);
              }
              if ((((RayK<1> *)local_108.valid)->org).field_0.m128[0] == 0.0) goto LAB_00ea5464;
            }
            (((Vec3f *)((long)local_108.ray + 0x30))->field_0).field_0.x = *(float *)local_108.hit;
            (((Vec3f *)((long)local_108.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_108.hit + 4);
            (((Vec3f *)((long)local_108.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_108.hit + 8);
            *(float *)((long)local_108.ray + 0x3c) = *(float *)(local_108.hit + 0xc);
            *(float *)((long)local_108.ray + 0x40) = *(float *)(local_108.hit + 0x10);
            *(float *)((long)local_108.ray + 0x44) = *(float *)(local_108.hit + 0x14);
            *(float *)((long)local_108.ray + 0x48) = *(float *)(local_108.hit + 0x18);
            *(float *)((long)local_108.ray + 0x4c) = *(float *)(local_108.hit + 0x1c);
            *(float *)((long)local_108.ray + 0x50) = *(float *)(local_108.hit + 0x20);
            pRVar17 = (RayHit *)local_108.ray;
          }
          else {
            (*pGVar9->intersectionFilterN)(&local_108);
            auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar31 = ZEXT1664(local_d8);
            if ((((RayK<1> *)local_108.valid)->org).field_0.m128[0] != 0.0) goto LAB_00ea536c;
LAB_00ea5464:
            (ray->super_RayK<1>).tfar = (float)local_148._0_4_;
            pRVar17 = (RayHit *)local_108.valid;
          }
          *(undefined4 *)(local_15c + lVar19 * 4 + 4) = 0;
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar26._4_4_ = fVar1;
          auVar26._0_4_ = fVar1;
          auVar26._8_4_ = fVar1;
          auVar26._12_4_ = fVar1;
          auVar24 = vcmpps_avx(auVar31._0_16_,auVar26,2);
          local_15c._4_16_ = vandps_avx(auVar24,local_15c._4_16_);
        }
        if ((((local_15c._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_15c._4_16_ >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_15c._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_15c[0x13]) {
          return;
        }
        auVar24 = vblendvps_avx(auVar34._0_16_,auVar31._0_16_,local_15c._4_16_);
        auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar25 = vminps_avx(auVar25,auVar24);
        auVar27 = vshufpd_avx(auVar25,auVar25,1);
        auVar25 = vminps_avx(auVar27,auVar25);
        auVar25 = vcmpps_avx(auVar24,auVar25,0);
        auVar27 = local_15c._4_16_ & auVar25;
        auVar24 = local_15c._4_16_;
        if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar27[0xf] < '\0') {
          auVar24 = vandps_avx(auVar25,local_15c._4_16_);
        }
        uVar16 = vmovmskps_avx(auVar24);
        uVar18 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar16);
        lVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }